

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O2

void __thiscall
FIX::ThreadedSocketInitiator::onConfigure(ThreadedSocketInitiator *this,SessionSettings *s)

{
  bool bVar1;
  int iVar2;
  Dictionary *this_00;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ReconnectInterval",&local_39);
  this_00 = &s->m_defaults;
  bVar1 = Dictionary::has(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"ReconnectInterval",&local_39);
    iVar2 = Dictionary::getInt(this_00,&local_38);
    this->m_reconnectInterval = iVar2;
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SocketNodelay",&local_39);
  bVar1 = Dictionary::has(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"SocketNodelay",&local_39);
    bVar1 = Dictionary::getBool(this_00,&local_38);
    this->m_noDelay = bVar1;
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"SocketSendBufferSize",&local_39);
  bVar1 = Dictionary::has(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"SocketSendBufferSize",&local_39);
    iVar2 = Dictionary::getInt(this_00,&local_38);
    this->m_sendBufSize = iVar2;
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"SocketReceiveBufferSize",&local_39);
  bVar1 = Dictionary::has(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"SocketReceiveBufferSize",&local_39);
    iVar2 = Dictionary::getInt(this_00,&local_38);
    this->m_rcvBufSize = iVar2;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

EXCEPT(ConfigError) {
  const Dictionary &dict = s.get();

  if (dict.has(RECONNECT_INTERVAL)) // ReconnectInterval in [DEFAULT]
  {
    m_reconnectInterval = dict.getInt(RECONNECT_INTERVAL);
  }
  if (dict.has(SOCKET_NODELAY)) {
    m_noDelay = dict.getBool(SOCKET_NODELAY);
  }
  if (dict.has(SOCKET_SEND_BUFFER_SIZE)) {
    m_sendBufSize = dict.getInt(SOCKET_SEND_BUFFER_SIZE);
  }
  if (dict.has(SOCKET_RECEIVE_BUFFER_SIZE)) {
    m_rcvBufSize = dict.getInt(SOCKET_RECEIVE_BUFFER_SIZE);
  }
}